

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression64::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,int64_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong maxOutputSize;
  long *plVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  long *local_40;
  
  if (numInts == 0) {
    maxOutputSize = 0;
  }
  else {
    maxOutputSize = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  if (workingSpace == (char *)0x0) {
    workingSpace = (char *)operator_new__(maxOutputSize);
    local_40 = (long *)workingSpace;
  }
  else {
    local_40 = (long *)0x0;
  }
  sVar3 = LZ4Compression::DecompressFromBuffer
                    (compressed,workingSpace,compressedSize,maxOutputSize,err);
  if (sVar3 == 0) {
    if (local_40 != (long *)0x0) {
      operator_delete__(local_40);
    }
    return 0;
  }
  lVar2 = *(long *)workingSpace;
  pbVar7 = (byte *)((long)workingSpace + 8);
  plVar6 = (long *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 8);
  lVar5 = 0;
  sVar3 = numInts;
  if (3 < numInts) {
    do {
      bVar1 = *pbVar7;
      iVar4 = 0;
      do {
        uVar8 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
        if (uVar8 == 3) {
          lVar9 = *plVar6;
          plVar6 = plVar6 + 1;
        }
        else if (uVar8 == 2) {
          lVar9 = *plVar6;
          plVar6 = (long *)((long)plVar6 + 4);
          lVar9 = (long)(int)lVar9;
        }
        else {
          lVar9 = lVar2;
          if (uVar8 == 1) {
            lVar9 = *plVar6;
            plVar6 = (long *)((long)plVar6 + 2);
            lVar9 = (long)(short)lVar9;
          }
        }
        lVar5 = lVar5 + lVar9;
        *ints = lVar5;
        ints = ints + 1;
        iVar4 = iVar4 + 2;
      } while (iVar4 != 8);
      pbVar7 = pbVar7 + 1;
      sVar3 = sVar3 - 4;
    } while (3 < sVar3);
    pbVar7 = (byte *)((long)workingSpace + (numInts - 4 >> 2) + 9);
  }
  sVar3 = (*(code *)(&DAT_003adb30 + *(int *)(&DAT_003adb30 + sVar3 * 4)))(pbVar7);
  return sVar3;
}

Assistant:

size_t
Usd_IntegerCompression64::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    int64_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}